

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void JS_DumpMemoryUsage(FILE *fp,JSMemoryUsage *s,JSRuntime *rt)

{
  uint uVar1;
  list_head *plVar2;
  bool bVar3;
  void *pvVar4;
  size_t sVar5;
  char *pcVar6;
  FILE *pFVar7;
  JSClassShortDef *pJVar8;
  ushort uVar9;
  ulong uVar10;
  long lVar11;
  int obj_classes [52];
  char buf [64];
  
  fprintf((FILE *)fp,"QuickJS memory usage -- 2021-03-27 version, %d-bit, malloc limit: %ld\n\n",
          0x40,s->malloc_limit);
  if (rt != (JSRuntime *)0x0) {
    bVar3 = false;
    for (lVar11 = 8; lVar11 != 0x58; lVar11 = lVar11 + 0x10) {
      uVar10 = *(ulong *)((long)&JS_DumpMemoryUsage::object_types[0].name + lVar11);
      pvVar4 = (*(rt->mf).js_malloc)(&rt->malloc_state,uVar10 & 0xffffffff);
      if (pvVar4 != (void *)0x0) {
        sVar5 = (*(rt->mf).js_malloc_usable_size)(pvVar4);
        if ((uint)uVar10 <= (uint)sVar5) {
          fprintf((FILE *)fp,"  %3u + %-2u  %s\n",uVar10 & 0xffffffff,
                  (ulong)((uint)sVar5 - (uint)uVar10),*(undefined8 *)(&UNK_0018e7d8 + lVar11));
          bVar3 = true;
        }
        (*(rt->mf).js_free)(&rt->malloc_state,pvVar4);
      }
    }
    if (!bVar3) {
      fwrite("  malloc_usable_size unavailable\n",0x21,1,(FILE *)fp);
    }
    memset(obj_classes,0,0xd0);
    plVar2 = &rt->gc_obj_list;
    while (plVar2 = plVar2->next, plVar2 != &rt->gc_obj_list) {
      if (((ulong)plVar2[-1].next & 0xf00000000) == 0) {
        uVar9 = *(ushort *)((long)&plVar2[-1].next + 6);
        if (0x32 < uVar9) {
          uVar9 = 0x33;
        }
        obj_classes[uVar9] = obj_classes[uVar9] + 1;
      }
    }
    uVar10 = 1;
    pFVar7 = fp;
    fwrite("\nJSObject classes\n",0x12,1,(FILE *)fp);
    if (obj_classes[0] != 0) {
      pFVar7 = (FILE *)0x0;
      fprintf((FILE *)fp,"  %5d  %2.0d %s\n",(ulong)(uint)obj_classes[0],0,"none");
    }
    pJVar8 = js_std_class_def;
    for (; uVar10 != 0x33; uVar10 = uVar10 + 1) {
      uVar1 = obj_classes[uVar10];
      if (uVar1 != 0) {
        pcVar6 = JS_AtomGetStrRT(rt,buf,pJVar8->class_name,(JSAtom)pFVar7);
        pFVar7 = (FILE *)(uVar10 & 0xffffffff);
        fprintf((FILE *)fp,"  %5d  %2.0d %s\n",(ulong)uVar1,pFVar7,pcVar6);
      }
      pJVar8 = pJVar8 + 1;
    }
    if (obj_classes[0x33] != 0) {
      fprintf((FILE *)fp,"  %5d  %2.0d %s\n",(ulong)(uint)obj_classes[0x33],0,"other");
    }
    fputc(10,(FILE *)fp);
  }
  fprintf((FILE *)fp,"%-20s %8s %8s\n","NAME","COUNT","SIZE");
  if (s->malloc_count != 0) {
    fprintf((FILE *)fp,"%-20s %8ld %8ld  (%0.1f per block)\n",
            (double)s->malloc_size / (double)s->malloc_count,"memory allocated");
    fprintf((FILE *)fp,"%-20s %8ld %8ld  (%d overhead, %0.1f average slack)\n",
            (double)(s->malloc_size - s->memory_used_size) / (double)s->memory_used_count,
            "memory used",s->memory_used_count,s->memory_used_size,8);
  }
  if (s->atom_count != 0) {
    fprintf((FILE *)fp,"%-20s %8ld %8ld  (%0.1f per atom)\n",
            (double)s->atom_size / (double)s->atom_count,"atoms");
  }
  if (s->str_count != 0) {
    fprintf((FILE *)fp,"%-20s %8ld %8ld  (%0.1f per string)\n",
            (double)s->str_size / (double)s->str_count,"strings");
  }
  if (s->obj_count != 0) {
    fprintf((FILE *)fp,"%-20s %8ld %8ld  (%0.1f per object)\n",
            (double)s->obj_size / (double)s->obj_count,"objects");
    fprintf((FILE *)fp,"%-20s %8ld %8ld  (%0.1f per object)\n",
            (double)s->prop_count / (double)s->obj_count,"  properties",s->prop_count,s->prop_size);
    fprintf((FILE *)fp,"%-20s %8ld %8ld  (%0.1f per shape)\n",
            (double)s->shape_size / (double)s->shape_count,"  shapes");
  }
  if (s->js_func_count != 0) {
    fprintf((FILE *)fp,"%-20s %8ld %8ld\n","bytecode functions",s->js_func_count,s->js_func_size);
    fprintf((FILE *)fp,"%-20s %8ld %8ld  (%0.1f per function)\n",
            (double)s->js_func_code_size / (double)s->js_func_count,"  bytecode");
    if (s->js_func_pc2line_count != 0) {
      fprintf((FILE *)fp,"%-20s %8ld %8ld  (%0.1f per function)\n",
              (double)s->js_func_pc2line_size / (double)s->js_func_pc2line_count,"  pc2line");
    }
  }
  if (s->c_func_count != 0) {
    fprintf((FILE *)fp,"%-20s %8ld\n","C functions");
  }
  if ((s->array_count != 0) &&
     (fprintf((FILE *)fp,"%-20s %8ld\n","arrays"), s->fast_array_count != 0)) {
    fprintf((FILE *)fp,"%-20s %8ld\n","  fast arrays");
    lVar11 = s->fast_array_elements;
    fprintf((FILE *)fp,"%-20s %8ld %8ld  (%0.1f per fast array)\n",
            (double)lVar11 / (double)s->fast_array_count,"  elements",lVar11,lVar11 << 4);
  }
  if (s->binary_object_count != 0) {
    fprintf((FILE *)fp,"%-20s %8ld %8ld\n","binary objects",s->binary_object_count,
            s->binary_object_size);
  }
  return;
}

Assistant:

void JS_DumpMemoryUsage(FILE *fp, const JSMemoryUsage *s, JSRuntime *rt)
{
    fprintf(fp, "QuickJS memory usage -- "
#ifdef CONFIG_BIGNUM
            "BigNum "
#endif
            CONFIG_VERSION " version, %d-bit, malloc limit: %"PRId64"\n\n",
            (int)sizeof(void *) * 8, (int64_t)(ssize_t)s->malloc_limit);
#if 1
    if (rt) {
        static const struct {
            const char *name;
            size_t size;
        } object_types[] = {
            { "JSRuntime", sizeof(JSRuntime) },
            { "JSContext", sizeof(JSContext) },
            { "JSObject", sizeof(JSObject) },
            { "JSString", sizeof(JSString) },
            { "JSFunctionBytecode", sizeof(JSFunctionBytecode) },
        };
        int i, usage_size_ok = 0;
        for(i = 0; i < countof(object_types); i++) {
            unsigned int size = object_types[i].size;
            void *p = js_malloc_rt(rt, size);
            if (p) {
                unsigned int size1 = js_malloc_usable_size_rt(rt, p);
                if (size1 >= size) {
                    usage_size_ok = 1;
                    fprintf(fp, "  %3u + %-2u  %s\n",
                            size, size1 - size, object_types[i].name);
                }
                js_free_rt(rt, p);
            }
        }
        if (!usage_size_ok) {
            fprintf(fp, "  malloc_usable_size unavailable\n");
        }
        {
            int obj_classes[JS_CLASS_INIT_COUNT + 1] = { 0 };
            int class_id;
            struct list_head *el;
            list_for_each(el, &rt->gc_obj_list) {
                JSGCObjectHeader *gp = list_entry(el, JSGCObjectHeader, link);
                JSObject *p;
                if (gp->gc_obj_type == JS_GC_OBJ_TYPE_JS_OBJECT) {
                    p = (JSObject *)gp;
                    obj_classes[min_uint32(p->class_id, JS_CLASS_INIT_COUNT)]++;
                }
            }
            fprintf(fp, "\n" "JSObject classes\n");
            if (obj_classes[0])
                fprintf(fp, "  %5d  %2.0d %s\n", obj_classes[0], 0, "none");
            for (class_id = 1; class_id < JS_CLASS_INIT_COUNT; class_id++) {
                if (obj_classes[class_id]) {
                    char buf[ATOM_GET_STR_BUF_SIZE];
                    fprintf(fp, "  %5d  %2.0d %s\n", obj_classes[class_id], class_id,
                            JS_AtomGetStrRT(rt, buf, sizeof(buf), js_std_class_def[class_id - 1].class_name));
                }
            }
            if (obj_classes[JS_CLASS_INIT_COUNT])
                fprintf(fp, "  %5d  %2.0d %s\n", obj_classes[JS_CLASS_INIT_COUNT], 0, "other");
        }
        fprintf(fp, "\n");
    }
#endif
    fprintf(fp, "%-20s %8s %8s\n", "NAME", "COUNT", "SIZE");

    if (s->malloc_count) {
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per block)\n",
                "memory allocated", s->malloc_count, s->malloc_size,
                (double)s->malloc_size / s->malloc_count);
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%d overhead, %0.1f average slack)\n",
                "memory used", s->memory_used_count, s->memory_used_size,
                MALLOC_OVERHEAD, ((double)(s->malloc_size - s->memory_used_size) /
                                  s->memory_used_count));
    }
    if (s->atom_count) {
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per atom)\n",
                "atoms", s->atom_count, s->atom_size,
                (double)s->atom_size / s->atom_count);
    }
    if (s->str_count) {
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per string)\n",
                "strings", s->str_count, s->str_size,
                (double)s->str_size / s->str_count);
    }
    if (s->obj_count) {
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per object)\n",
                "objects", s->obj_count, s->obj_size,
                (double)s->obj_size / s->obj_count);
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per object)\n",
                "  properties", s->prop_count, s->prop_size,
                (double)s->prop_count / s->obj_count);
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per shape)\n",
                "  shapes", s->shape_count, s->shape_size,
                (double)s->shape_size / s->shape_count);
    }
    if (s->js_func_count) {
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"\n",
                "bytecode functions", s->js_func_count, s->js_func_size);
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per function)\n",
                "  bytecode", s->js_func_count, s->js_func_code_size,
                (double)s->js_func_code_size / s->js_func_count);
        if (s->js_func_pc2line_count) {
            fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per function)\n",
                    "  pc2line", s->js_func_pc2line_count,
                    s->js_func_pc2line_size,
                    (double)s->js_func_pc2line_size / s->js_func_pc2line_count);
        }
    }
    if (s->c_func_count) {
        fprintf(fp, "%-20s %8"PRId64"\n", "C functions", s->c_func_count);
    }
    if (s->array_count) {
        fprintf(fp, "%-20s %8"PRId64"\n", "arrays", s->array_count);
        if (s->fast_array_count) {
            fprintf(fp, "%-20s %8"PRId64"\n", "  fast arrays", s->fast_array_count);
            fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per fast array)\n",
                    "  elements", s->fast_array_elements,
                    s->fast_array_elements * (int)sizeof(JSValue),
                    (double)s->fast_array_elements / s->fast_array_count);
        }
    }
    if (s->binary_object_count) {
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"\n",
                "binary objects", s->binary_object_count, s->binary_object_size);
    }
}